

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

void __thiscall absl::Cord::ChunkIterator::InitTree(ChunkIterator *this,CordRep *tree)

{
  CordRep *edge;
  CordRepBtree *tree_00;
  string_view sVar1;
  
  edge = cord_internal::SkipCrcNode(tree);
  if (edge->tag == '\x03') {
    tree_00 = cord_internal::CordRep::btree(edge);
    sVar1 = cord_internal::CordRepBtreeReader::Init(&this->btree_reader_,tree_00);
  }
  else {
    this->current_leaf_ = edge;
    sVar1 = cord_internal::EdgeData(edge);
  }
  this->current_chunk_ = sVar1;
  return;
}

Assistant:

inline void Cord::ChunkIterator::InitTree(
    cord_internal::CordRep* absl_nonnull tree) {
  tree = cord_internal::SkipCrcNode(tree);
  if (tree->tag == cord_internal::BTREE) {
    current_chunk_ = btree_reader_.Init(tree->btree());
  } else {
    current_leaf_ = tree;
    current_chunk_ = cord_internal::EdgeData(tree);
  }
}